

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O1

void __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::makeBorderBucket
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *b,size_t id)

{
  pointer ppVar1;
  iterator __position;
  size_t sVar2;
  pointer ppVar3;
  size_t local_8;
  
  ppVar3 = (this->borderBuckets).
           super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->borderBuckets).
           super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar2 = 0xffffffffffffffff;
  if (ppVar3 != ppVar1) {
    do {
      if (((ppVar3->second)._M_data)->id == b->id) {
        sVar2 = ppVar3->first;
        break;
      }
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar1);
  }
  if (sVar2 != id) {
    __position._M_current =
         (this->borderBuckets).
         super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->borderBuckets).
        super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_8 = id;
      std::
      vector<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>>>
      ::_M_realloc_insert<unsigned_long&,dg::vr::Bucket_const&>
                ((vector<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>>>
                  *)&this->borderBuckets,__position,&local_8,b);
    }
    else {
      (__position._M_current)->first = id;
      ((__position._M_current)->second)._M_data = b;
      (this->borderBuckets).
      super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void makeBorderBucket(const Bucket &b, size_t id) {
        size_t currentId = getBorderId(b);
        if (currentId == id)
            return;

        assert(getBorderB(id) == nullptr);
        assert(getBorderId(b) == std::string::npos);
        borderBuckets.emplace_back(id, b);
    }